

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O2

int BuildHuffmanTable(HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size,
                     uint16_t *sorted)

{
  uint uVar1;
  int iVar2;
  ushort uVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  HuffmanCode HVar8;
  uint key;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  HuffmanCode *pHVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  HuffmanCode *local_f8;
  int local_e4;
  int count [16];
  int offset [16];
  
  bVar4 = (byte)root_bits;
  iVar23 = 1;
  iVar22 = 1 << (bVar4 & 0x1f);
  count[0xc] = 0;
  count[0xd] = 0;
  count[0xe] = 0;
  count[0xf] = 0;
  count[8] = 0;
  count[9] = 0;
  count[10] = 0;
  count[0xb] = 0;
  count[4] = 0;
  count[5] = 0;
  count[6] = 0;
  count[7] = 0;
  count[0] = 0;
  count[1] = 0;
  count[2] = 0;
  count[3] = 0;
  uVar12 = 0;
  uVar18 = 0;
  if (0 < code_lengths_size) {
    uVar18 = (ulong)(uint)code_lengths_size;
  }
  for (; uVar18 != uVar12; uVar12 = uVar12 + 1) {
    if (0xf < (long)code_lengths[uVar12]) goto LAB_0011cd27;
    count[code_lengths[uVar12]] = count[code_lengths[uVar12]] + 1;
  }
  if (count[0] == code_lengths_size) {
LAB_0011cd27:
    iVar22 = 0;
  }
  else {
    offset[1] = 0;
    for (lVar9 = 0; lVar9 != 0xe; lVar9 = lVar9 + 1) {
      if (1 << ((char)lVar9 + 1U & 0x1f) < count[lVar9 + 1]) goto LAB_0011cd27;
      offset[lVar9 + 2] = count[lVar9 + 1] + offset[lVar9 + 1];
    }
    for (uVar12 = 0; auVar7 = _DAT_00121960, auVar6 = _DAT_001216d0, auVar5 = _DAT_0011f490,
        uVar18 != uVar12; uVar12 = uVar12 + 1) {
      lVar9 = (long)code_lengths[uVar12];
      if (0 < lVar9) {
        if (sorted == (uint16_t *)0x0) {
          offset[lVar9] = offset[lVar9] + 1;
        }
        else {
          iVar28 = offset[lVar9];
          offset[lVar9] = iVar28 + 1;
          sorted[iVar28] = (uint16_t)uVar12;
        }
      }
    }
    if (offset[0xf] == 1) {
      if (sorted != (uint16_t *)0x0) {
        HVar8 = (HuffmanCode)((uint)*sorted << 0x10);
        lVar14 = (long)iVar22;
        lVar9 = 1;
        if (1 < lVar14) {
          lVar9 = lVar14;
        }
        lVar19 = lVar9 + -1;
        auVar25._8_4_ = (int)lVar19;
        auVar25._0_8_ = lVar19;
        auVar25._12_4_ = (int)((ulong)lVar19 >> 0x20);
        pHVar15 = root_table + lVar14 + -1;
        uVar12 = 0;
        auVar25 = auVar25 ^ _DAT_001216d0;
        do {
          auVar26._8_4_ = (int)uVar12;
          auVar26._0_8_ = uVar12;
          auVar26._12_4_ = (int)(uVar12 >> 0x20);
          auVar27 = (auVar26 | auVar5) ^ auVar6;
          iVar23 = auVar25._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar23 && auVar25._0_4_ < auVar27._0_4_ ||
                      iVar23 < auVar27._4_4_) & 1)) {
            *pHVar15 = HVar8;
          }
          if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
              auVar27._12_4_ <= auVar25._12_4_) {
            pHVar15[-1] = HVar8;
          }
          auVar26 = (auVar26 | auVar7) ^ auVar6;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar23 && (iVar28 != iVar23 || auVar26._0_4_ <= auVar25._0_4_)) {
            pHVar15[-2] = HVar8;
            pHVar15[-3] = HVar8;
          }
          uVar12 = uVar12 + 4;
          pHVar15 = pHVar15 + -4;
        } while (((int)lVar9 + 3U & 0xfffffffc) != uVar12);
      }
    }
    else {
      uVar1 = iVar22 - 1;
      key = 0;
      iVar28 = 0;
      if (0 < root_bits) {
        iVar28 = root_bits;
      }
      iVar21 = 2;
      lVar9 = 0;
      iVar10 = 1;
      for (uVar12 = 1; uVar12 != iVar28 + 1; uVar12 = uVar12 + 1) {
        iVar24 = count[uVar12];
        iVar13 = iVar10 * 2 - iVar24;
        if (iVar13 < 0) goto LAB_0011cd27;
        if (root_table != (HuffmanCode *)0x0) {
          local_f8._0_4_ = (uint)uVar12 & 0xff;
          lVar9 = (long)(int)lVar9;
          while (0 < iVar24) {
            uVar3 = sorted[lVar9];
            iVar20 = iVar22;
            do {
              iVar2 = iVar20 - iVar21;
              iVar20 = iVar20 - iVar21;
              root_table[(ulong)key + (long)iVar2] =
                   (HuffmanCode)((uint)uVar3 * 0x10000 + (uint)local_f8);
            } while (0 < iVar20);
            lVar9 = lVar9 + 1;
            key = GetNextKey(key,(uint)uVar12);
            iVar24 = iVar24 + -1;
            count[uVar12] = iVar24;
          }
        }
        iVar23 = iVar23 + iVar10 * 2;
        iVar21 = iVar21 * 2;
        iVar10 = iVar13;
      }
      lVar14 = (long)root_bits;
      iVar28 = 2;
      uVar17 = 0xffffffff;
      local_f8 = root_table;
      local_e4 = iVar22;
      while (lVar14 < 0xf) {
        lVar14 = lVar14 + 1;
        iVar21 = count[lVar14];
        iVar24 = iVar10 * 2 - iVar21;
        if (iVar24 < 0) goto LAB_0011cd27;
        if (root_table != (HuffmanCode *)0x0) {
          uVar11 = (int)lVar14 - root_bits;
          lVar9 = (long)(int)lVar9;
          while (0 < iVar21) {
            uVar16 = key & uVar1;
            if (uVar16 != uVar17) {
              local_f8 = local_f8 + iVar22;
              iVar22 = 1 << ((byte)uVar11 & 0x1f);
              for (lVar19 = lVar14; lVar19 < 0xf; lVar19 = lVar19 + 1) {
                iVar21 = iVar22 - count[lVar19];
                if (iVar21 == 0 || iVar22 < count[lVar19]) goto LAB_0011d081;
                iVar22 = iVar21 * 2;
              }
              lVar19 = 0xf;
LAB_0011d081:
              iVar22 = 1 << ((uint8_t)lVar19 - bVar4 & 0x1f);
              local_e4 = local_e4 + iVar22;
              root_table[uVar16].bits = (uint8_t)lVar19;
              root_table[uVar16].value =
                   (short)((uint)((int)local_f8 - (int)root_table) >> 2) - (short)uVar16;
              uVar17 = uVar16;
            }
            uVar3 = sorted[lVar9];
            iVar21 = iVar22;
            do {
              iVar13 = iVar21 - iVar28;
              iVar21 = iVar21 - iVar28;
              local_f8[(ulong)(key >> (bVar4 & 0x1f)) + (long)iVar13] =
                   (HuffmanCode)((uint)uVar3 * 0x10000 + (uVar11 & 0xff));
            } while (0 < iVar21);
            lVar9 = lVar9 + 1;
            key = GetNextKey(key,(int)lVar14);
            iVar21 = count[lVar14] + -1;
            count[lVar14] = iVar21;
          }
        }
        iVar23 = iVar23 + iVar10 * 2;
        iVar28 = iVar28 * 2;
        iVar10 = iVar24;
      }
      iVar22 = 0;
      if (iVar23 == offset[0xf] * 2 + -1) {
        iVar22 = local_e4;
      }
    }
  }
  return iVar22;
}

Assistant:

static int BuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                             const int code_lengths[], int code_lengths_size,
                             uint16_t sorted[]) {
  HuffmanCode* table = root_table;  // next available space in table
  int total_size = 1 << root_bits;  // total size root table + 2nd level table
  int len;                          // current code length
  int symbol;                       // symbol index in original or sorted table
  // number of codes of each length:
  int count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };
  // offsets in sorted table for each length:
  int offset[MAX_ALLOWED_CODE_LENGTH + 1];

  assert(code_lengths_size != 0);
  assert(code_lengths != NULL);
  assert((root_table != NULL && sorted != NULL) ||
         (root_table == NULL && sorted == NULL));
  assert(root_bits > 0);

  // Build histogram of code lengths.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    if (code_lengths[symbol] > MAX_ALLOWED_CODE_LENGTH) {
      return 0;
    }
    ++count[code_lengths[symbol]];
  }

  // Error, all code lengths are zeros.
  if (count[0] == code_lengths_size) {
    return 0;
  }

  // Generate offsets into sorted symbol table by code length.
  offset[1] = 0;
  for (len = 1; len < MAX_ALLOWED_CODE_LENGTH; ++len) {
    if (count[len] > (1 << len)) {
      return 0;
    }
    offset[len + 1] = offset[len] + count[len];
  }

  // Sort symbols by length, by symbol order within each length.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    const int symbol_code_length = code_lengths[symbol];
    if (code_lengths[symbol] > 0) {
      if (sorted != NULL) {
        sorted[offset[symbol_code_length]++] = symbol;
      } else {
        offset[symbol_code_length]++;
      }
    }
  }

  // Special case code with only one value.
  if (offset[MAX_ALLOWED_CODE_LENGTH] == 1) {
    if (sorted != NULL) {
      HuffmanCode code;
      code.bits = 0;
      code.value = (uint16_t)sorted[0];
      ReplicateValue(table, 1, total_size, code);
    }
    return total_size;
  }

  {
    int step;              // step size to replicate values in current table
    uint32_t low = -1;     // low bits for current root entry
    uint32_t mask = total_size - 1;    // mask for low bits
    uint32_t key = 0;      // reversed prefix code
    int num_nodes = 1;     // number of Huffman tree nodes
    int num_open = 1;      // number of open branches in current tree level
    int table_bits = root_bits;        // key length of current table
    int table_size = 1 << table_bits;  // size of current table
    symbol = 0;
    // Fill in root table.
    for (len = 1, step = 2; len <= root_bits; ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        code.bits = (uint8_t)len;
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Fill in 2nd level tables and add pointers to root table.
    for (len = root_bits + 1, step = 2; len <= MAX_ALLOWED_CODE_LENGTH;
         ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        if ((key & mask) != low) {
          table += table_size;
          table_bits = NextTableBitSize(count, len, root_bits);
          table_size = 1 << table_bits;
          total_size += table_size;
          low = key & mask;
          root_table[low].bits = (uint8_t)(table_bits + root_bits);
          root_table[low].value = (uint16_t)((table - root_table) - low);
        }
        code.bits = (uint8_t)(len - root_bits);
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key >> root_bits], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Check if tree is full.
    if (num_nodes != 2 * offset[MAX_ALLOWED_CODE_LENGTH] - 1) {
      return 0;
    }
  }

  return total_size;
}